

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiWindowSettings * ImGui::FindOrCreateWindowSettings(char *name)

{
  int iVar1;
  char *pcVar2;
  ImGuiID IVar3;
  ImGuiWindowSettings *pIVar4;
  ImGuiWindowSettings *pIVar5;
  
  IVar3 = ImHashStr(name,0,0);
  pcVar2 = (GImGui->SettingsWindows).Buf.Data;
  if (pcVar2 != (char *)0x0) {
    pIVar5 = (ImGuiWindowSettings *)(pcVar2 + 4);
    pIVar4 = pIVar5;
    do {
      if (pIVar4->ID == IVar3) {
        return pIVar4;
      }
      iVar1._0_1_ = pIVar4[-1].Collapsed;
      iVar1._1_1_ = pIVar4[-1].WantApply;
      iVar1._2_2_ = *(undefined2 *)&pIVar4[-1].field_0xe;
      pIVar4 = (ImGuiWindowSettings *)((long)&pIVar4->ID + (long)iVar1);
    } while (pIVar4 != (ImGuiWindowSettings *)
                       ((long)&pIVar5->ID + (long)(GImGui->SettingsWindows).Buf.Size));
  }
  pIVar4 = CreateNewWindowSettings(name);
  return pIVar4;
}

Assistant:

ImGuiWindowSettings* ImGui::FindOrCreateWindowSettings(const char* name)
{
    if (ImGuiWindowSettings* settings = FindWindowSettings(ImHashStr(name)))
        return settings;
    return CreateNewWindowSettings(name);
}